

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cpp
# Opt level: O1

string * (anonymous_namespace)::input_name_abi_cxx11_(void)

{
  uint uVar1;
  string *in_RDI;
  
  uVar1 = pstore::command_line::option::get_num_occurrences((option *)json_source_abi_cxx11_);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if (uVar1 == 0) {
    (in_RDI->field_2)._M_local_buf[4] = 'n';
    *(undefined4 *)&in_RDI->field_2 = 0x69647473;
    in_RDI->_M_string_length = 5;
    (in_RDI->field_2)._M_local_buf[5] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char*>();
  }
  return in_RDI;
}

Assistant:

std::string input_name () { return is_file_input () ? json_source.get () : "stdin"s; }